

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopt.c
# Opt level: O1

int gopt(char **argv,option *options)

{
  char *__s;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  size_t __n;
  option *poVar6;
  size_t sVar7;
  uint uVar8;
  char **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char cVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  int local_5c;
  uint local_58;
  
  poVar6 = options;
  if ((options->flags & 0x100) == 0) {
    uVar8 = 1;
    do {
      poVar6->argument = (char *)0x0;
      poVar6->count = 0;
      poVar6 = options + uVar8;
      uVar11 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
    } while ((options[uVar11].flags & 0x100) == 0);
  }
  poVar6->short_name = '\0';
  uVar8 = 0;
  poVar6->long_name = (char *)0x0;
  poVar6->argument = (char *)0x0;
  poVar6->count = 0;
  pcVar16 = argv[1];
  if (pcVar16 == (char *)0x0) {
    uVar3 = 1;
    uVar11 = 0;
  }
  else {
    ppcVar9 = argv + 1;
    uVar11 = 0;
    uVar4 = 1;
    uVar10 = 1;
    uVar8 = 0;
    bVar1 = false;
    do {
      if (bVar1) {
        argv[uVar4] = pcVar16;
        uVar4 = (ulong)((int)uVar4 + 1);
LAB_00102aef:
        bVar1 = true;
      }
      else {
        if (uVar8 == 0) {
LAB_00102b45:
          pcVar16 = *ppcVar9;
          if (*pcVar16 == '-') {
            if ((pcVar16[1] == '-') && (pcVar16[2] == '\0')) {
              uVar8 = 0;
              goto LAB_00102aef;
            }
            if (pcVar16[1] != '-') {
              if (pcVar16[1] == '\0') goto LAB_00102d5f;
              pcVar16 = *ppcVar9;
              cVar13 = pcVar16[1];
              if (cVar13 == '\0') goto LAB_00102d67;
              uVar12 = 1;
              uVar3 = 0;
              do {
                uVar11 = 0;
                if ((options->flags & 0x100) == 0) {
                  uVar11 = 0;
                  poVar6 = options;
                  do {
                    if (poVar6->short_name == cVar13) break;
                    uVar11 = (ulong)((int)uVar11 + 1);
                    poVar6 = options + uVar11;
                  } while ((options[uVar11].flags & 0x100) == 0);
                }
                options[uVar11].count = options[uVar11].count + 1;
                poVar6 = options + uVar11;
                uVar14 = options[uVar11].flags;
                iVar2 = (int)uVar12;
                if ((uVar14 >> 8 & 1) != 0) {
                  if (poVar6->short_name == '\0') {
                    poVar6->short_name = pcVar16[uVar12];
                  }
                  uVar12 = (ulong)(iVar2 + 1);
                  if (pcVar16[uVar12] == '\0') {
                    poVar6->argument = (char *)0x0;
                    uVar14 = uVar14 | 0x10;
                  }
                  else {
LAB_00102dcf:
                    poVar6->argument = pcVar16 + uVar12;
                    uVar14 = uVar14 | 0x20;
                  }
                  poVar6->flags = uVar14;
                  bVar1 = false;
                  uVar8 = uVar3;
                  break;
                }
                if ((uVar14 & 1) == 0) {
                  uVar12 = (ulong)(iVar2 + 1);
                  if (pcVar16[uVar12] != '\0') goto LAB_00102dcf;
                  uVar8 = 0x20;
                  if ((uVar14 & 2) == 0) goto LAB_00102d2d;
                }
                else {
LAB_00102d2d:
                  poVar6->argument = (char *)0x0;
                  poVar6->flags = uVar14 | 0x10;
                  uVar8 = uVar3;
                }
                uVar12 = (ulong)(iVar2 + 1);
                pcVar16 = *ppcVar9;
                cVar13 = pcVar16[uVar12];
                bVar1 = false;
                uVar3 = uVar8;
              } while (cVar13 != '\0');
              goto LAB_00102d6c;
            }
            pcVar16 = pcVar16 + 2;
            pcVar5 = strchr(pcVar16,0x3d);
            __n = strcspn(pcVar16,"=");
            uVar11 = 0;
            if ((options->flags & 0x100) == 0) {
              local_5c = 0;
              poVar6 = options;
              uVar12 = uVar11;
              uVar15 = 0;
              do {
                uVar11 = uVar12;
                __s = poVar6->long_name;
                uVar12 = uVar11;
                if (__s != (char *)0x0) {
                  sVar7 = strlen(__s);
                  bVar1 = true;
                  if (__n <= sVar7) {
                    iVar2 = strncasecmp(__s,pcVar16,__n);
                    if (iVar2 == 0) {
                      if (__n == sVar7) {
                        bVar1 = false;
                        uVar11 = uVar15;
                        goto LAB_00102c14;
                      }
                      local_5c = local_5c + 1;
                      local_58 = (uint)uVar15;
                    }
                    bVar1 = true;
                  }
LAB_00102c14:
                  uVar12 = uVar11;
                  if (!bVar1) goto LAB_00102c3c;
                }
                uVar11 = (ulong)((uint)uVar15 + 1);
                poVar6 = options + uVar11;
                uVar15 = uVar11;
              } while ((options[uVar11].flags & 0x100) == 0);
              if (local_5c == 1) {
                uVar11 = (ulong)local_58;
              }
            }
LAB_00102c3c:
            options[uVar11].count = options[uVar11].count + 1;
            uVar8 = options[uVar11].flags;
            if (((uVar8 >> 8 & 1) != 0) && (options[uVar11].long_name == (char *)0x0)) {
              options[uVar11].long_name = pcVar16;
            }
            if (pcVar5 == (char *)0x0) {
              if ((uVar8 & 2) == 0) {
                options[uVar11].argument = (char *)0x0;
                uVar8 = uVar8 | 0x40;
                goto LAB_00102d98;
              }
              uVar8 = 0x80;
            }
            else {
              options[uVar11].argument = pcVar5 + 1;
              uVar8 = uVar8 | 0x80;
LAB_00102d98:
              options[uVar11].flags = uVar8;
              uVar8 = 0;
            }
            bVar1 = false;
            goto LAB_00102d6c;
          }
LAB_00102d5f:
          argv[uVar4] = pcVar16;
          uVar4 = (ulong)((int)uVar4 + 1);
        }
        else {
          if ((*pcVar16 == '-') && (pcVar16[1] != '\0')) {
            if ((options[uVar11].flags & 4) != 0) {
              options[uVar11].flags = options[uVar11].flags | uVar8 >> 1;
              options[uVar11].argument = (char *)0x0;
              goto LAB_00102b45;
            }
          }
          options[uVar11].flags = options[uVar11].flags | uVar8;
          options[uVar11].argument = pcVar16;
        }
LAB_00102d67:
        bVar1 = false;
        uVar8 = 0;
      }
LAB_00102d6c:
      uVar3 = (uint)uVar4;
      uVar10 = (ulong)((int)uVar10 + 1);
      ppcVar9 = argv + uVar10;
      pcVar16 = *ppcVar9;
    } while (pcVar16 != (char *)0x0);
  }
  if (uVar8 != 0) {
    options[uVar11].flags = options[uVar11].flags | uVar8 >> 1;
    options[uVar11].argument = (char *)0x0;
  }
  argv[uVar3] = (char *)0x0;
  return uVar3;
}

Assistant:

int gopt (char **argv, struct option *options)
{
  unsigned int operand_count = 1;
  unsigned int doubledash    = 0;
  unsigned int expecting     = 0;
  unsigned int option_index  = 0;
  unsigned int i, j;

  for (i = 0; !(options[i].flags & GOPT_LAST); i++)
  {
    options[i].argument = NULL;
    options[i].count    = 0;
  }

  options[i].short_name = 0;
  options[i].long_name  = NULL;
  options[i].argument   = NULL;
  options[i].count      = 0;

  for (i = 1; argv[i]; i++)
  {
    if (doubledash)
    {
      argv[operand_count] = argv[i];
      operand_count++;
      continue;
    }

    if (expecting)
    {
      if ((argv[i][0] != '-') || !argv[i][1] || !(options[option_index].flags & GOPT_ARGUMENT_NO_HYPHEN))
      {
        options[option_index].flags    |= expecting;
        options[option_index].argument  = argv[i];
        expecting = 0;
        continue;
      }
      else
      {
        options[option_index].flags    |= (expecting >> 1); /* change _WITH to _WITHOUT */
        options[option_index].argument  =  NULL;
        expecting = 0;
      }
    }

    if ((argv[i][0] == '-') && (argv[i][1] == '-') && (argv[i][2] == 0))
    {
      doubledash = 1;
      continue;
    }

    if ((argv[i][0] == '-') && (argv[i][1] == '-'))
    {
      char *eq = strchr (&argv[i][2], '=');

      option_index = long_option_get_index (&argv[i][2], options);

      options[option_index].count++;

      if ((options[option_index].flags & GOPT_LAST) && !options[option_index].long_name)
      {
        options[option_index].long_name = &argv[i][2];
      }

      if (eq)
      {
        options[option_index].argument  = (eq + 1);
        options[option_index].flags    |= GOPT_SEEN_LONG_WITH;
      }
      else if (options[option_index].flags & GOPT_ARGUMENT_REQUIRED)
      {
        expecting = GOPT_SEEN_LONG_WITH;
      }
      else
      {
        options[option_index].argument  = NULL;
        options[option_index].flags    |= GOPT_SEEN_LONG_WITHOUT;
      }
    }
    else if ((argv[i][0] == '-') && argv[i][1])
    {
      for (j = 1; argv[i][j]; j++)
      {
        option_index = short_option_get_index (argv[i][j], options);

        options[option_index].count++;

        if (options[option_index].flags & GOPT_LAST)
        {
          if (!options[option_index].short_name)
          {
            options[option_index].short_name = argv[i][j];
          }

          if (argv[i][j+1])
          {
            options[option_index].argument  = &argv[i][j+1];
            options[option_index].flags    |= GOPT_SEEN_SHORT_WITH;
          }
          else
          {
            options[option_index].argument  = NULL;
            options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
          }
          break;
        }

        if (options[option_index].flags & GOPT_ARGUMENT_FORBIDDEN)
        {
          options[option_index].argument  = NULL;
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
        }

        else if (argv[i][j+1])
        {
          options[option_index].argument  = &argv[i][j+1];
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITH;
          break;
        }

        else if (options[option_index].flags & GOPT_ARGUMENT_REQUIRED)
        {
          expecting = GOPT_SEEN_SHORT_WITH;
        }

        else
        {
          options[option_index].argument  = NULL;
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
        }
      }
    }
    else
    {
      argv[operand_count] = argv[i];
      operand_count++;
    }
  }

  if (expecting)
  {
    options[option_index].flags    |= (expecting >> 1); /* change _WITH to _WITHOUT */
    options[option_index].argument  =  NULL;
  }

  argv[operand_count] = NULL;
  return operand_count;
}